

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Convolution::Convolution(Convolution *this,int filterLength,double *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  int *piVar7;
  double *pdVar8;
  int local_2c;
  int local_28;
  int i_2;
  int i_1;
  int i;
  double *filter_local;
  int filterLength_local;
  Convolution *this_local;
  
  this->m_filter_len = filterLength;
  this->m_fft_len = filterLength << 1;
  this->m_fft_n = 1;
  while (2 << ((byte)this->m_fft_n & 0x1f) < this->m_fft_len) {
    this->m_fft_n = this->m_fft_n + 1;
  }
  this->m_ip_len = (2 << ((byte)((this->m_fft_n + -1) / 2) & 0x1f)) + 2;
  this->m_w_len = 2 << ((char)this->m_fft_n - 1U & 0x1f);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->m_ip_len;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar7 = (int *)operator_new__(uVar6);
  this->m_ip = piVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->m_w_len;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar6);
  this->m_work = pdVar8;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->m_fft_len;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar6);
  this->m_filter = pdVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->m_fft_len;
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar6);
  this->m_fft_buff = pdVar8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)this->m_fft_len;
  uVar6 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar6);
  this->m_filter_result = pdVar8;
  *this->m_ip = 0;
  for (i_2 = 0; i_2 < this->m_fft_len; i_2 = i_2 + 1) {
    this->m_filter_result[i_2] = 0.0;
  }
  for (local_28 = 0; local_28 < this->m_filter_len; local_28 = local_28 + 1) {
    this->m_filter[local_28] = filter[local_28] * (1.0 / (double)this->m_filter_len);
  }
  for (local_2c = this->m_filter_len; local_2c < this->m_fft_len; local_2c = local_2c + 1) {
    this->m_filter[local_2c] = 0.0;
  }
  rdft(this->m_fft_len,1,this->m_filter,this->m_ip,this->m_work);
  return;
}

Assistant:

Convolution(int filterLength, const double *filter)
	{
		m_filter_len = filterLength;
		m_fft_len = filterLength * 2;
		m_fft_n = 1;
		while ((2 << m_fft_n) < m_fft_len) {
			m_fft_n++;
		}
		m_ip_len = 2 + (2 << ((m_fft_n - 1)/2));
		m_w_len = 2 << (m_fft_n - 1);
		m_ip = new int[m_ip_len];
		m_work = new double[m_w_len];
		m_filter = new double[m_fft_len];
		m_fft_buff = new double[m_fft_len];
		m_filter_result = new double[m_fft_len];
		
		m_ip[0] = 0;
		
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] = .0;
		}
		
		for (int i=0; i<m_filter_len; ++i) {
			m_filter[i] = filter[i] * (1.0 / m_filter_len);
		}
		for (int i=m_filter_len; i<m_fft_len; ++i) {
			m_filter[i] = .0;
		}
		rdft(m_fft_len, 1, m_filter, m_ip, m_work);
	}